

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::TrySetTextureProperties
          (FBXConverter *this,aiMaterial *out_mat,LayeredTextureMap *layeredTextures,
          string *propName,aiTextureType target,MeshGeometry *mesh)

{
  float *__return_storage_ptr__;
  Geometry *pGVar1;
  bool bVar2;
  __type _Var3;
  reference ppVar4;
  Texture *tex_00;
  aiVector2D *paVar5;
  PropertyTable *this_00;
  long lVar6;
  iterator __first;
  iterator __first_00;
  iterator __last;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
  __last_00;
  difference_type dVar7;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar8;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *this_01;
  undefined1 useTemplate;
  MeshGeometry *local_cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c80;
  format local_c60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  format local_aa8;
  string local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_910;
  string *name_1;
  uint i_1;
  int index_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  format local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  format local_708;
  int local_58c;
  string local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_568;
  string *name;
  uint i;
  int index;
  int *local_550;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_548;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_540;
  vector<int,_std::allocator<int>_> *local_538;
  MatIndexArray *mats;
  MeshGeometry *meshGeom;
  value_type *v;
  iterator __end6;
  iterator __begin6;
  MeshMap *__range6;
  uint local_4e8 [2];
  uint matIndex;
  allocator local_4d1;
  undefined1 local_4d0 [32];
  _Rb_tree_node_base local_4b0;
  _Base_ptr local_490;
  string *uvSet;
  bool ok;
  PropertyTable *pPStack_480;
  int uvIndex;
  PropertyTable *props;
  aiUVTransform uvTrafo;
  aiString path;
  Texture *tex;
  BlendMode local_50;
  int texIndex;
  int blendmode;
  int texCount;
  _Self local_40;
  const_iterator it;
  MeshGeometry *mesh_local;
  aiTextureType target_local;
  string *propName_local;
  LayeredTextureMap *layeredTextures_local;
  aiMaterial *out_mat_local;
  FBXConverter *this_local;
  
  it._M_node = (_Base_ptr)mesh;
  layeredTextures_local = (LayeredTextureMap *)out_mat;
  out_mat_local = (aiMaterial *)this;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
       ::find(layeredTextures,propName);
  _blendmode = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
               ::end(layeredTextures);
  bVar2 = std::operator==(&local_40,(_Self *)&blendmode);
  if (!bVar2) {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>
             ::operator*(&local_40);
    texIndex = LayeredTexture::textureCount(ppVar4->second);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>
             ::operator*(&local_40);
    local_50 = LayeredTexture::GetBlendMode(ppVar4->second);
    aiMaterial::AddProperty
              ((aiMaterial *)layeredTextures_local,(int *)&local_50,1,"$tex.op",target,0);
    for (tex._4_4_ = 0; (int)tex._4_4_ < texIndex; tex._4_4_ = tex._4_4_ + 1) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>
               ::operator*(&local_40);
      tex_00 = LayeredTexture::getTexture(ppVar4->second,tex._4_4_);
      __return_storage_ptr__ = &uvTrafo.mScaling.y;
      GetTexturePath((aiString *)__return_storage_ptr__,this,tex_00);
      aiMaterial::AddProperty
                ((aiMaterial *)layeredTextures_local,(aiString *)__return_storage_ptr__,"$tex.file",
                 target,tex._4_4_);
      aiUVTransform::aiUVTransform((aiUVTransform *)&props);
      paVar5 = Texture::UVScaling(tex_00);
      uvTrafo.mTranslation = *paVar5;
      paVar5 = Texture::UVTranslation(tex_00);
      props = *(PropertyTable **)paVar5;
      useTemplate = (undefined1)tex._4_4_;
      aiMaterial::AddProperty
                ((aiMaterial *)layeredTextures_local,(aiUVTransform *)&props,1,"$tex.uvtrafo",target
                 ,tex._4_4_);
      this_00 = Texture::Props(tex_00);
      uvSet._4_4_ = 0;
      pPStack_480 = this_00;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_4d0,"UVSet",&local_4d1);
      PropertyGet<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_4d0 + 0x20),(FBX *)this_00,(PropertyTable *)local_4d0,
                 (string *)((long)&uvSet + 3),(bool *)0x0,(bool)useTemplate);
      std::__cxx11::string::~string((string *)local_4d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
      local_490 = (_Base_ptr)(local_4d0 + 0x20);
      if ((((uvSet._3_1_ & 1) != 0) &&
          (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_490,"default"), bVar2)) &&
         (lVar6 = std::__cxx11::string::length(), lVar6 != 0)) {
        this_01 = &this->materials;
        __first = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin(this_01);
        __first_00 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin(this_01);
        __last = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::end(this_01);
        __last_00 = std::
                    find<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,aiMaterial*>
                              (__first_00._M_current,__last._M_current,
                               (aiMaterial **)&layeredTextures_local);
        dVar7 = std::
                distance<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>>
                          ((__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                            )__first._M_current,__last_00);
        local_4e8[0] = (uint)dVar7;
        uvSet._4_4_ = 0xffffffff;
        if (it._M_node == (_Base_ptr)0x0) {
          __end6 = std::
                   map<const_Assimp::FBX::Geometry_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                   ::begin(&this->meshes_converted);
          v = (value_type *)
              std::
              map<const_Assimp::FBX::Geometry_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::end(&this->meshes_converted);
          while (bVar2 = std::operator!=(&__end6,(_Self *)&v), bVar2) {
            meshGeom = (MeshGeometry *)
                       std::
                       _Rb_tree_iterator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ::operator*(&__end6);
            pGVar1 = (Geometry *)(meshGeom->super_Geometry).super_Object._vptr_Object;
            if (pGVar1 == (Geometry *)0x0) {
              local_cf8 = (MeshGeometry *)0x0;
            }
            else {
              local_cf8 = (MeshGeometry *)
                          __dynamic_cast(pGVar1,&Geometry::typeinfo,&MeshGeometry::typeinfo,0);
            }
            mats = (MatIndexArray *)local_cf8;
            if (local_cf8 != (MeshGeometry *)0x0) {
              local_538 = MeshGeometry::GetMaterialIndices(local_cf8);
              local_548._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(local_538)
              ;
              local_550 = (int *)std::vector<int,_std::allocator<int>_>::end(local_538);
              local_540 = std::
                          find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,unsigned_int>
                                    (local_548,
                                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                      )local_550,local_4e8);
              _i = std::vector<int,_std::allocator<int>_>::end(local_538);
              bVar2 = __gnu_cxx::operator==
                                (&local_540,
                                 (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&i);
              if (!bVar2) {
                name._4_4_ = 0xffffffff;
                for (name._0_4_ = 0; (uint)name < 8; name._0_4_ = (uint)name + 1) {
                  pvVar8 = MeshGeometry::GetTextureCoords((MeshGeometry *)mats,(uint)name);
                  bVar2 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::empty
                                    (pvVar8);
                  if (bVar2) break;
                  MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                            (&local_588,(MeshGeometry *)mats,(uint)name);
                  local_568 = &local_588;
                  _Var3 = std::operator==(local_568,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_490);
                  if (_Var3) {
                    name._4_4_ = (uint)name;
                    local_58c = 7;
                  }
                  else {
                    local_58c = 0;
                  }
                  std::__cxx11::string::~string((string *)&local_588);
                  if (local_58c != 0) break;
                }
                if (name._4_4_ == 0xffffffff) {
                  std::operator+(&local_748,"did not find UV channel named ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_490);
                  std::operator+(&local_728,&local_748," in a mesh using this material");
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  basic_formatter<std::__cxx11::string>
                            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_708,&local_728);
                  LogFunctions<Assimp::FBXImporter>::LogWarn(&local_708);
                  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                  ~basic_formatter(&local_708);
                  std::__cxx11::string::~string((string *)&local_728);
                  std::__cxx11::string::~string((string *)&local_748);
                }
                else if (uvSet._4_4_ == 0xffffffff) {
                  uvSet._4_4_ = name._4_4_;
                }
                else {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&i_1,"the UV channel named ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_490);
                  std::operator+(&local_8e0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&i_1,
                                 " appears at different positions in meshes, results will be wrong")
                  ;
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  basic_formatter<std::__cxx11::string>
                            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_8c0,&local_8e0);
                  LogFunctions<Assimp::FBXImporter>::LogWarn(&local_8c0);
                  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                  ~basic_formatter(&local_8c0);
                  std::__cxx11::string::~string((string *)&local_8e0);
                  std::__cxx11::string::~string((string *)&i_1);
                }
              }
            }
            std::
            _Rb_tree_iterator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::operator++(&__end6);
          }
        }
        else {
          name_1._4_4_ = 0xffffffff;
          for (name_1._0_4_ = 0; (uint)name_1 < 8; name_1._0_4_ = (uint)name_1 + 1) {
            pvVar8 = MeshGeometry::GetTextureCoords((MeshGeometry *)it._M_node,(uint)name_1);
            bVar2 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::empty
                              (pvVar8);
            if (bVar2) break;
            MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                      (&local_930,(MeshGeometry *)it._M_node,(uint)name_1);
            local_910 = &local_930;
            _Var3 = std::operator==(local_910,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_490);
            if (_Var3) {
              name_1._4_4_ = (uint)name_1;
              local_58c = 10;
            }
            else {
              local_58c = 0;
            }
            std::__cxx11::string::~string((string *)&local_930);
            if (local_58c != 0) break;
          }
          if (name_1._4_4_ == 0xffffffff) {
            std::operator+(&local_ae8,"did not find UV channel named ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_490);
            std::operator+(&local_ac8,&local_ae8," in a mesh using this material");
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
            basic_formatter<std::__cxx11::string>
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_aa8,&local_ac8);
            LogFunctions<Assimp::FBXImporter>::LogWarn(&local_aa8);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_formatter(&local_aa8);
            std::__cxx11::string::~string((string *)&local_ac8);
            std::__cxx11::string::~string((string *)&local_ae8);
          }
          if (uvSet._4_4_ == 0xffffffff) {
            uvSet._4_4_ = name_1._4_4_;
          }
        }
        if (uvSet._4_4_ == 0xffffffff) {
          std::operator+(&local_ca0,"failed to resolve UV channel ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_490);
          std::operator+(&local_c80,&local_ca0,", using first UV channel");
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_c60
                     ,&local_c80);
          LogFunctions<Assimp::FBXImporter>::LogWarn(&local_c60);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_c60);
          std::__cxx11::string::~string((string *)&local_c80);
          std::__cxx11::string::~string((string *)&local_ca0);
          uvSet._4_4_ = 0;
        }
      }
      aiMaterial::AddProperty
                ((aiMaterial *)layeredTextures_local,(int *)((long)&uvSet + 4),1,"$tex.uvwsrc",
                 target,tex._4_4_);
      std::__cxx11::string::~string((string *)(local_4d0 + 0x20));
    }
  }
  return;
}

Assistant:

void FBXConverter::TrySetTextureProperties(aiMaterial* out_mat, const LayeredTextureMap& layeredTextures,
            const std::string& propName,
            aiTextureType target, const MeshGeometry* const mesh) {
            LayeredTextureMap::const_iterator it = layeredTextures.find(propName);
            if (it == layeredTextures.end()) {
                return;
            }

            int texCount = (*it).second->textureCount();

            // Set the blend mode for layered textures
            int blendmode = (*it).second->GetBlendMode();
            out_mat->AddProperty(&blendmode, 1, _AI_MATKEY_TEXOP_BASE, target, 0);

            for (int texIndex = 0; texIndex < texCount; texIndex++) {

                const Texture* const tex = (*it).second->getTexture(texIndex);

                aiString path = GetTexturePath(tex);
                out_mat->AddProperty(&path, _AI_MATKEY_TEXTURE_BASE, target, texIndex);

                aiUVTransform uvTrafo;
                // XXX handle all kinds of UV transformations
                uvTrafo.mScaling = tex->UVScaling();
                uvTrafo.mTranslation = tex->UVTranslation();
                out_mat->AddProperty(&uvTrafo, 1, _AI_MATKEY_UVTRANSFORM_BASE, target, texIndex);

                const PropertyTable& props = tex->Props();

                int uvIndex = 0;

                bool ok;
                const std::string& uvSet = PropertyGet<std::string>(props, "UVSet", ok);
                if (ok) {
                    // "default" is the name which usually appears in the FbxFileTexture template
                    if (uvSet != "default" && uvSet.length()) {
                        // this is a bit awkward - we need to find a mesh that uses this
                        // material and scan its UV channels for the given UV name because
                        // assimp references UV channels by index, not by name.

                        // XXX: the case that UV channels may appear in different orders
                        // in meshes is unhandled. A possible solution would be to sort
                        // the UV channels alphabetically, but this would have the side
                        // effect that the primary (first) UV channel would sometimes
                        // be moved, causing trouble when users read only the first
                        // UV channel and ignore UV channel assignments altogether.

                        const unsigned int matIndex = static_cast<unsigned int>(std::distance(materials.begin(),
                            std::find(materials.begin(), materials.end(), out_mat)
                        ));

                        uvIndex = -1;
                        if (!mesh)
                        {
                            for (const MeshMap::value_type& v : meshes_converted) {
                                const MeshGeometry* const meshGeom = dynamic_cast<const MeshGeometry*> (v.first);
                                if (!meshGeom) {
                                    continue;
                                }

                                const MatIndexArray& mats = meshGeom->GetMaterialIndices();
                                if (std::find(mats.begin(), mats.end(), matIndex) == mats.end()) {
                                    continue;
                                }

                                int index = -1;
                                for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                    if (meshGeom->GetTextureCoords(i).empty()) {
                                        break;
                                    }
                                    const std::string& name = meshGeom->GetTextureCoordChannelName(i);
                                    if (name == uvSet) {
                                        index = static_cast<int>(i);
                                        break;
                                    }
                                }
                                if (index == -1) {
                                    FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                                    continue;
                                }

                                if (uvIndex == -1) {
                                    uvIndex = index;
                                }
                                else {
                                    FBXImporter::LogWarn("the UV channel named " + uvSet +
                                        " appears at different positions in meshes, results will be wrong");
                                }
                            }
                        }
                        else
                        {
                            int index = -1;
                            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                if (mesh->GetTextureCoords(i).empty()) {
                                    break;
                                }
                                const std::string& name = mesh->GetTextureCoordChannelName(i);
                                if (name == uvSet) {
                                    index = static_cast<int>(i);
                                    break;
                                }
                            }
                            if (index == -1) {
                                FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                            }

                            if (uvIndex == -1) {
                                uvIndex = index;
                            }
                        }

                        if (uvIndex == -1) {
                            FBXImporter::LogWarn("failed to resolve UV channel " + uvSet + ", using first UV channel");
                            uvIndex = 0;
                        }
                    }
                }

                out_mat->AddProperty(&uvIndex, 1, _AI_MATKEY_UVWSRC_BASE, target, texIndex);
            }
        }